

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void emit_adobe_app14(j_compress_ptr cinfo)

{
  int iVar1;
  long in_RDI;
  JPEG_MARKER in_stack_ffffffffffffffec;
  int val;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 uVar2;
  uint in_stack_fffffffffffffff4;
  
  emit_marker((j_compress_ptr)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
              in_stack_ffffffffffffffec);
  emit_2bytes((j_compress_ptr)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
              in_stack_ffffffffffffffec);
  emit_byte((j_compress_ptr)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),
            in_stack_ffffffffffffffec);
  val = 100;
  emit_byte((j_compress_ptr)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),100);
  emit_byte((j_compress_ptr)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),val);
  emit_byte((j_compress_ptr)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),val);
  emit_byte((j_compress_ptr)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),val);
  emit_2bytes((j_compress_ptr)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0),val);
  uVar2 = 0;
  emit_2bytes((j_compress_ptr)((ulong)in_stack_fffffffffffffff4 << 0x20),val);
  emit_2bytes((j_compress_ptr)CONCAT44(in_stack_fffffffffffffff4,uVar2),val);
  iVar1 = *(int *)(in_RDI + 0x50);
  if (iVar1 == 3) {
    emit_byte((j_compress_ptr)CONCAT44(3,uVar2),val);
  }
  else if (iVar1 == 5) {
    emit_byte((j_compress_ptr)CONCAT44(5,uVar2),val);
  }
  else {
    emit_byte((j_compress_ptr)CONCAT44(iVar1,uVar2),val);
  }
  return;
}

Assistant:

LOCAL(void)
emit_adobe_app14(j_compress_ptr cinfo)
/* Emit an Adobe APP14 marker */
{
  /*
   * Length of APP14 block      (2 bytes)
   * Block ID                   (5 bytes - ASCII "Adobe")
   * Version Number             (2 bytes - currently 100)
   * Flags0                     (2 bytes - currently 0)
   * Flags1                     (2 bytes - currently 0)
   * Color transform            (1 byte)
   *
   * Although Adobe TN 5116 mentions Version = 101, all the Adobe files
   * now in circulation seem to use Version = 100, so that's what we write.
   *
   * We write the color transform byte as 1 if the JPEG color space is
   * YCbCr, 2 if it's YCCK, 0 otherwise.  Adobe's definition has to do with
   * whether the encoder performed a transformation, which is pretty useless.
   */

  emit_marker(cinfo, M_APP14);

  emit_2bytes(cinfo, 2 + 5 + 2 + 2 + 2 + 1); /* length */

  emit_byte(cinfo, 0x41);       /* Identifier: ASCII "Adobe" */
  emit_byte(cinfo, 0x64);
  emit_byte(cinfo, 0x6F);
  emit_byte(cinfo, 0x62);
  emit_byte(cinfo, 0x65);
  emit_2bytes(cinfo, 100);      /* Version */
  emit_2bytes(cinfo, 0);        /* Flags0 */
  emit_2bytes(cinfo, 0);        /* Flags1 */
  switch (cinfo->jpeg_color_space) {
  case JCS_YCbCr:
    emit_byte(cinfo, 1);        /* Color transform = 1 */
    break;
  case JCS_YCCK:
    emit_byte(cinfo, 2);        /* Color transform = 2 */
    break;
  default:
    emit_byte(cinfo, 0);        /* Color transform = 0 */
    break;
  }
}